

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcFaceSurface::~IfcFaceSurface(IfcFaceSurface *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  void *pvVar3;
  
  *(undefined8 *)&this[-1].super_IfcFace.field_0x50 = 0x8947e0;
  *(undefined8 *)&(this->super_IfcFace).field_0x38 = 0x894880;
  this[-1].SameSense._M_dataplus._M_p = (pointer)0x894808;
  this[-1].SameSense.field_2._M_allocated_capacity = 0x894830;
  (this->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x894858;
  puVar2 = *(undefined1 **)
            &(this->super_IfcFace).super_IfcTopologicalRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x18;
  puVar1 = &(this->super_IfcFace).super_IfcTopologicalRepresentationItem.field_0x28;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)&this[-1].super_IfcFace.field_0x50 = 0x894958;
  *(undefined8 *)&(this->super_IfcFace).field_0x38 = 0x8949d0;
  this[-1].SameSense._M_dataplus._M_p = "\x10eW";
  this[-1].SameSense.field_2._M_allocated_capacity = 0x8949a8;
  pvVar3 = *(void **)&this[-1].field_0x80;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)&this[-1].field_0x90 - (long)pvVar3);
    return;
  }
  return;
}

Assistant:

IfcFaceSurface() : Object("IfcFaceSurface") {}